

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addressOperations.cpp
# Opt level: O0

bool gmlc::networking::isIpv6(string *address)

{
  int iVar1;
  const_iterator __value;
  char *__s;
  size_type sVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  size_type brkcnt;
  difference_type cntcolon;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  char __c;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar4;
  
  __value = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            begin(in_stack_ffffffffffffffc8);
  __c = (char)((ulong)in_stack_ffffffffffffffc8 >> 0x38);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
            (in_stack_ffffffffffffffd8);
  uVar3 = 0x3a;
  __s = (char *)std::count<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                          (in_RDI,in_stack_ffffffffffffffe8,__value._M_current);
  if ((long)__s < 3) {
    sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar3,in_stack_ffffffffffffffd0),__c,0x7d7557);
    if (sVar2 == 0xffffffffffffffff) {
      iVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)brkcnt,
                      CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                      (size_type)in_RDI._M_current,__s);
      if (iVar1 == 0) {
        bVar4 = true;
      }
      else {
        bVar4 = false;
      }
    }
    else {
      bVar4 = true;
    }
  }
  else {
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool isIpv6(const std::string& address)
{
    auto cntcolon = std::count(address.begin(), address.end(), ':');
    if (cntcolon > 2) {
        return true;
    }

    auto brkcnt = address.find_first_of('[');
    if (brkcnt != std::string::npos) {
        return true;
    }
    if (address.compare(0, 2, "::") == 0) {
        return true;
    }
    return false;
}